

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetPrivate::selectionChanged
          (QTreeWidgetPrivate *this,QItemSelection *selected,QItemSelection *deselected)

{
  QTreeModel *this_00;
  qsizetype qVar1;
  QTreeWidgetItem *pQVar2;
  QTreeWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *item_1;
  QTreeWidgetItem *item;
  QTreeModel *m;
  int i;
  QTreeWidget *q;
  QModelIndexList indices;
  QTreeModel *in_stack_ffffffffffffff58;
  QList<QModelIndex> *in_stack_ffffffffffffff60;
  int local_5c;
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::indexes();
  this_00 = treeModel((QTreeWidgetPrivate *)0x916dc0);
  local_5c = 0;
  while( true ) {
    qVar1 = QList<QModelIndex>::size(&local_20);
    if (qVar1 <= local_5c) break;
    QList<QModelIndex>::at(in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58);
    pQVar2 = QTreeModel::item(in_stack_ffffffffffffff58,(QModelIndex *)0x916e1a);
    pQVar2->d->field_0x20 = pQVar2->d->field_0x20 & 0xfd | 2;
    local_5c = local_5c + 1;
  }
  QItemSelection::indexes();
  QList<QModelIndex>::operator=
            (in_stack_ffffffffffffff60,(QList<QModelIndex> *)in_stack_ffffffffffffff58);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x916e6c);
  local_5c = 0;
  while( true ) {
    qVar1 = QList<QModelIndex>::size(&local_20);
    if (qVar1 <= local_5c) break;
    QList<QModelIndex>::at((QList<QModelIndex> *)this_00,(qsizetype)in_stack_ffffffffffffff58);
    pQVar2 = QTreeModel::item(in_stack_ffffffffffffff58,(QModelIndex *)0x916ec1);
    pQVar2->d->field_0x20 = pQVar2->d->field_0x20 & 0xfd;
    local_5c = local_5c + 1;
  }
  QTreeWidget::itemSelectionChanged((QTreeWidget *)0x916ef2);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x916eff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetPrivate::selectionChanged(const QItemSelection &selected, const QItemSelection &deselected)
{
    Q_Q(QTreeWidget);
    QModelIndexList indices = selected.indexes();
    int i;
    QTreeModel *m = treeModel();
    for (i = 0; i < indices.size(); ++i) {
        QTreeWidgetItem *item = m->item(indices.at(i));
        item->d->selected = true;
    }

    indices = deselected.indexes();
    for (i = 0; i < indices.size(); ++i) {
        QTreeWidgetItem *item = m->item(indices.at(i));
        item->d->selected = false;
    }

    emit q->itemSelectionChanged();
}